

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::insertNode
          (iterator *this,uint32_t level,NodeRef node,interval<unsigned_long> *key,
          allocator_type *alloc)

{
  Path *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  uint uVar4;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this_01;
  void *pvVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  uint32_t uVar8;
  uint uVar9;
  uintptr_t intWord;
  IndexPair offset;
  pointer pEVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  this_00 = &(this->super_const_iterator).path;
  bVar13 = level == 1;
  if (bVar13) {
    this_01 = (this->super_const_iterator).map;
    uVar9 = this_01->rootSize;
    uVar4 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
            offset;
    if (uVar9 < 8) {
      while (uVar9 != uVar4) {
        uVar11 = (ulong)uVar9;
        uVar9 = uVar9 - 1;
        *(undefined8 *)((long)&this_01->field_0 + uVar11 * 8) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar9 * 8);
        puVar1 = (undefined8 *)((long)&this_01->field_0 + (ulong)uVar9 * 0x10 + 0x40);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&this_01->field_0 + uVar11 * 0x10 + 0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      }
      *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)&this_01->field_0 + (ulong)uVar4 * 8)
           = node.pip.value;
      uVar7 = key->right;
      puVar3 = (unsigned_long *)((long)&this_01->field_0 + (ulong)uVar4 * 0x10 + 0x40);
      *puVar3 = key->left;
      puVar3[1] = uVar7;
      uVar8 = this_01->rootSize + 1;
      this_01->rootSize = uVar8;
      pEVar10 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar10->size = uVar8;
      uVar11 = *(ulong *)((long)pEVar10->node + (ulong)pEVar10->offset * 8);
      pEVar10[1].node = (void *)(uVar11 & 0xffffffffffffffc0);
      pEVar10[1].size = ((uint)uVar11 & 0x3f) + 1;
      return false;
    }
    offset = IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::
             modifyRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>,slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>,false>
                       ((IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *)this_01,
                        (BranchNode<unsigned_long,_8U,_true> *)this_01,uVar4,alloc);
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (this_00,(BranchNode<unsigned_long,_8U,_true> *)this_01,this_01->rootSize,offset);
    level = 2;
  }
  uVar4 = level - 1;
  uVar11 = (ulong)uVar4;
  IntervalMapDetails::Path::legalizeForInsert(this_00,uVar4);
  pEVar10 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar9 = pEVar10[uVar11].size;
  if (uVar9 == 8) {
    bVar13 = IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::iterator::
             overflow<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((iterator *)this,uVar4,alloc);
    if (bVar13) {
      uVar11 = (ulong)level;
    }
    pEVar10 = (this->super_const_iterator).path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar9 = pEVar10[uVar11].size;
  }
  pvVar5 = pEVar10[uVar11].node;
  uVar4 = pEVar10[uVar11].offset;
  while (uVar9 != uVar4) {
    uVar12 = (ulong)uVar9;
    uVar9 = uVar9 - 1;
    *(undefined8 *)((long)pvVar5 + uVar12 * 8) = *(undefined8 *)((long)pvVar5 + (ulong)uVar9 * 8);
    puVar1 = (undefined8 *)((long)pvVar5 + (ulong)uVar9 * 0x10 + 0x40);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)pvVar5 + uVar12 * 0x10 + 0x40);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
  }
  ((PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)pvVar5 + (ulong)uVar4 * 8))->value =
       (uintptr_t)node.pip.value;
  uVar7 = key->right;
  puVar3 = (unsigned_long *)((long)pvVar5 + (ulong)uVar4 * 0x10 + 0x40);
  *puVar3 = key->left;
  puVar3[1] = uVar7;
  pEVar10 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar9 = pEVar10[uVar11].size;
  pEVar10[uVar11].size = uVar9 + 1;
  uVar8 = (uint32_t)uVar11;
  if (uVar8 != 0) {
    *(ulong *)((long)pEVar10[uVar8 - 1].node + (ulong)pEVar10[uVar8 - 1].offset * 8) =
         *(ulong *)((long)pEVar10[uVar8 - 1].node + (ulong)pEVar10[uVar8 - 1].offset * 8) &
         0xffffffffffffffc0 | (ulong)uVar9;
  }
  updateParentBounds(this,uVar8,key);
  pEVar10 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar11 = *(ulong *)((long)pEVar10[uVar11].node + (ulong)pEVar10[uVar11].offset * 8);
  pEVar10[uVar8 + 1].node = (void *)(uVar11 & 0xffffffffffffffc0);
  pEVar10[uVar8 + 1].size = ((uint)uVar11 & 0x3f) + 1;
  return bVar13;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}